

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ClosestPointData * __thiscall
CMeshClosestPointMapper::SamplePoint::ClosestPoint(SamplePoint *this,int fi)

{
  size_type sVar1;
  reference pvVar2;
  ClosestPointData *q;
  int i;
  int fi_local;
  SamplePoint *this_local;
  
  sVar1 = std::
          vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
          ::capacity(&this->m_closestMeshPts);
  if (sVar1 < 0x1e) {
    std::
    vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
    ::reserve(&this->m_closestMeshPts,0x1e);
  }
  q._0_4_ = 0;
  while( true ) {
    sVar1 = std::
            vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
            ::size(&this->m_closestMeshPts);
    if (sVar1 <= (ulong)(long)(int)q) {
      std::
      vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
      ::emplace_back<>(&this->m_closestMeshPts);
      pvVar2 = std::
               vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
               ::back(&this->m_closestMeshPts);
      ClosestPtToMeshFace(this->m_mesh,fi,&this->m_pt,&pvVar2->m_P,&pvVar2->m_t);
      pvVar2->m_fi = fi;
      return pvVar2;
    }
    pvVar2 = std::
             vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
             ::operator[](&this->m_closestMeshPts,(long)(int)q);
    if (pvVar2->m_fi == fi) break;
    q._0_4_ = (int)q + 1;
  }
  pvVar2 = std::
           vector<CMeshClosestPointMapper::ClosestPointData,_std::allocator<CMeshClosestPointMapper::ClosestPointData>_>
           ::operator[](&this->m_closestMeshPts,(long)(int)q);
  return pvVar2;
}

Assistant:

const ClosestPointData& ClosestPoint(int fi)
    {
      if (m_closestMeshPts.capacity() < 30)
      {
        m_closestMeshPts.reserve(30);
      }
      for (int i = 0; i < m_closestMeshPts.size(); i++)
      {
        if (m_closestMeshPts[i].m_fi == fi)
        {
          return m_closestMeshPts[i];
        }
      }
      m_closestMeshPts.emplace_back();
      ClosestPointData& q = m_closestMeshPts.back();
      ::ClosestPtToMeshFace(&m_mesh, fi, m_pt, q.m_P, q.m_t);
      q.m_fi = fi;
      return q;
    }